

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O2

ByteData * __thiscall
cfd::core::Psbt::GetTxInSignature
          (ByteData *__return_storage_ptr__,Psbt *this,uint32_t index,Pubkey *pubkey)

{
  void *pvVar1;
  long lVar2;
  long lVar3;
  CfdException *pCVar4;
  allocator local_65;
  int ret;
  undefined1 local_60 [32];
  size_t exist;
  vector<unsigned_char,_std::allocator<unsigned_char>_> key_vec;
  
  pvVar1 = this->wally_psbt_pointer_;
  Pubkey::GetData((ByteData *)local_60,pubkey);
  ByteData::GetBytes(&key_vec,(ByteData *)local_60);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_60);
  exist = 0;
  ret = wally_map_find((wally_map *)(*(long *)((long)pvVar1 + 0x10) + (ulong)index * 0x110 + 0x60),
                       key_vec.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                       (long)key_vec.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)key_vec.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start,&exist);
  if (ret != 0) {
    local_60._0_8_ = "cfdcore_psbt.cpp";
    local_60._8_4_ = 0xaab;
    local_60._16_8_ = "GetTxInSignature";
    logger::warn<int&>((CfdSourceLocation *)local_60,"wally_map_find NG[{}]",&ret);
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string((string *)local_60,"psbt find signature key error.",&local_65);
    CfdException::CfdException(pCVar4,kCfdMemoryFullError,(string *)local_60);
    __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if (exist != 0) {
    lVar2 = *(long *)(*(long *)((long)pvVar1 + 0x10) + 0x60 + (ulong)index * 0x110);
    lVar3 = (ulong)((int)exist - 1) * 0x20;
    ByteData::ByteData(__return_storage_ptr__,*(uint8_t **)(lVar2 + 0x10 + lVar3),
                       *(uint32_t *)(lVar2 + 0x18 + lVar3));
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&key_vec.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    return __return_storage_ptr__;
  }
  local_60._0_8_ = "cfdcore_psbt.cpp";
  local_60._8_4_ = 0xaaf;
  local_60._16_8_ = "GetTxInSignature";
  logger::warn<>((CfdSourceLocation *)local_60,"target key not found.");
  pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string
            ((string *)local_60,"psbt signature target key not found.",&local_65);
  CfdException::CfdException(pCVar4,kCfdIllegalStateError,(string *)local_60);
  __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ByteData Psbt::GetTxInSignature(uint32_t index, const Pubkey &pubkey) const {
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);
  auto key_vec = pubkey.GetData().GetBytes();
  size_t exist = 0;
  int ret = wally_map_find(
      &psbt_pointer->inputs[index].signatures, key_vec.data(), key_vec.size(),
      &exist);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_map_find NG[{}]", ret);
    throw CfdException(kCfdMemoryFullError, "psbt find signature key error.");
  }
  if (exist == 0) {
    warn(CFD_LOG_SOURCE, "target key not found.");
    throw CfdException(
        kCfdIllegalStateError, "psbt signature target key not found.");
  }
  uint32_t map_index = static_cast<uint32_t>(exist) - 1;
  return ByteData(
      psbt_pointer->inputs[index].signatures.items[map_index].value,
      static_cast<uint32_t>(
          psbt_pointer->inputs[index].signatures.items[map_index].value_len));
}